

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int wave_chain(char *buf,uint bufSize)

{
  int iVar1;
  undefined8 in_RDI;
  gpioExtent_t *unaff_retaddr;
  int in_stack_00000008;
  gpioExtent_t ext [1];
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  
  iVar1 = pigpio_command_ext(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
                             in_stack_ffffffffffffffe8,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,0,
                             unaff_retaddr,in_stack_00000008);
  return iVar1;
}

Assistant:

int wave_chain(char *buf, unsigned bufSize)
{
   gpioExtent_t ext[1];

   /*
   p1=0
   p2=0
   p3=bufSize
   ## extension ##
   char buf[bufSize]
   */

   ext[0].size = bufSize;
   ext[0].ptr = buf;

   return pigpio_command_ext
      (gPigCommand, PI_CMD_WVCHA, 0, 0, bufSize, 1, ext, 1);
}